

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall mpt::reference<mpt::layout::graph::world>::type::type(type *this,uintptr_t initial)

{
  layout::graph::world::world(&this->super_world,0);
  (this->super_world).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_0014e368;
  (this->super_world).super_object._vptr_object = (_func_int **)&PTR_property_0014e3b8;
  (this->_ref)._val = initial;
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }